

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

int get_version_array(char *dir,char *file)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *lf_cp_1;
  int *piVar5;
  DIR *__dirp;
  dirent *pdVar6;
  long lVar8;
  size_t __nmemb;
  char *lf_cp;
  byte *pbVar9;
  char ver [16];
  stat sbuf;
  char lcased_file [255];
  char name [255];
  ulong uVar7;
  
  pbVar9 = (byte *)lcased_file;
  strcpy((char *)pbVar9,file);
  separate_version((char *)pbVar9,ver,1);
  for (; bVar1 = *pbVar9, bVar1 != 0; pbVar9 = pbVar9 + 1) {
    if ((byte)(bVar1 + 0xbf) < 0x1a) {
      *pbVar9 = bVar1 | 0x20;
    }
  }
  alarm(TIMEOUT_TIME);
  piVar5 = __errno_location();
  do {
    *piVar5 = 0;
    iVar2 = stat(dir,(stat *)&sbuf);
    if (iVar2 != -1) {
      alarm(0);
      if ((((sbuf.st_ino == VA.dir_ino) && (iVar2 = strcmp(lcased_file,VA.name), iVar2 == 0)) &&
          (sbuf.st_mtim.tv_sec == VA.lastMTime.tv_sec)) &&
         (sbuf.st_mtim.tv_nsec == VA.lastMTime.tv_nsec)) {
        return 1;
      }
      VA.dir_ino = sbuf.st_ino;
      VA.lastMTime.tv_nsec = sbuf.st_mtim.tv_nsec;
      VA.lastMTime.tv_sec = sbuf.st_mtim.tv_sec;
      strcpy(VA.name,lcased_file);
      *piVar5 = 0;
      alarm(TIMEOUT_TIME);
      goto LAB_00116a27;
    }
  } while (*piVar5 == 4);
  goto LAB_00116a3e;
LAB_00116ab7:
  alarm(TIMEOUT_TIME);
  pdVar6 = readdir(__dirp);
  alarm(0);
  __nmemb = (size_t)iVar2;
  if (pdVar6 == (dirent *)0x0) {
    if (*piVar5 != 4) goto LAB_00116bc6;
  }
  else {
    strcpy(name,pdVar6->d_name);
    separate_version(name,ver,1);
    for (pbVar9 = (byte *)name; bVar1 = *pbVar9, bVar1 != 0; pbVar9 = pbVar9 + 1) {
      if ((byte)(bVar1 + 0xbf) < 0x1a) {
        *pbVar9 = bVar1 | 0x20;
      }
    }
    iVar3 = strcmp(name,lcased_file);
    if (iVar3 == 0) {
      strcpy(VA.files[__nmemb].name,pdVar6->d_name);
      if (ver[0] == '\0') {
        uVar4 = 0;
      }
      else {
        uVar7 = strtoul(ver,(char **)0x0,10);
        uVar4 = (uint)uVar7;
      }
      VA.files[__nmemb].version_no = uVar4;
      if (0x7ce < iVar2) {
        *Lisp_errno = 5;
        return 0;
      }
      iVar2 = iVar2 + 1;
      lVar8 = (long)VA.allocated;
      if (VA.allocated <= iVar2) {
        VA.allocated = (int)(lVar8 + 200);
        VA.files = (FileName *)realloc(VA.files,(lVar8 + 200) * 0x1004);
      }
    }
  }
  *piVar5 = 0;
  goto LAB_00116ab7;
LAB_00116bc6:
  VA.files[__nmemb].version_no = 0xffffffff;
  VA.lastUsed = iVar2;
  if ((VA.files)->version_no != 0xffffffff) {
    strcpy(name,(VA.files)->name);
    separate_version(name,ver,1);
    strcpy(VA.files[__nmemb].name,name);
    if (1 < iVar2) {
      qsort(VA.files,__nmemb,0x1004,compare_file_versions);
    }
  }
  alarm(TIMEOUT_TIME);
  do {
    *piVar5 = 0;
    iVar2 = closedir(__dirp);
    if (iVar2 != -1) break;
  } while (*piVar5 == 4);
  alarm(0);
  return 1;
  while (*piVar5 == 4) {
LAB_00116a27:
    *piVar5 = 0;
    __dirp = opendir(dir);
    if (__dirp != (DIR *)0x0) {
      iVar2 = 0;
      alarm(0);
      if (VA.files == (FileName *)0x0) {
        VA.files = (FileName *)calloc(200,0x1004);
        VA.allocated = 200;
      }
      goto LAB_00116ab7;
    }
  }
LAB_00116a3e:
  alarm(0);
  *Lisp_errno = *piVar5;
  return 0;
}

Assistant:

static int get_version_array(char *dir, char *file)
{
#ifdef DOS
  /* DOS version-array builder */
  char lcased_file[MAXPATHLEN];
  char old_file[MAXPATHLEN];
  char name[MAXNAMLEN];
  char ver[VERSIONLEN];
  int varray_index = 0;
  struct find_t dirp;
  struct direct *dp;
  int rval, drive = 0, isslash = 0;
  struct stat sbuf;
  int res;

  /*
   * First of all, prepare a lower cased file name for the case insensitive
   * search.  Also we have to separate file name from its version field.
   */
  if (dir[1] == DRIVESEP) drive = dir[0];

  if (strcmp(dir, "\\") == 0)
    isslash = 1;
  else if (drive && (strcmp(dir + 2, "\\") == 0))
    isslash = 1;

  if (!isslash)
    strcpy(lcased_file, dir); /* Only add the dir if it's real */
  else if (drive) {
    lcased_file[0] = drive;
    lcased_file[1] = DRIVESEP;
    lcased_file[2] = '\0';
  } else
    *lcased_file = '\0';

  /*  strcpy(lcased_file, dir);   removed when above code added 3/4/93 */
  strcat(lcased_file, DIRSEPSTR);
  strcat(lcased_file, file);
  separate_version(lcased_file, ver, 1);
  DOWNCASE(lcased_file);

  /*************************************************/
  /* First, look up the backup version of the file */
  /*************************************************/

  /* First, make the "backup-file-name" for this file */

  make_old_version(old_file, lcased_file);

  TIMEOUT(res = _dos_findfirst(old_file, _A_NORMAL | _A_SUBDIR, &dirp));
  if (res == 0) {
    strcpy(name, dirp.name);
    strcpy(VA.files[varray_index].name, name);
    VA.files[varray_index].version_no = 0;
    varray_index++;
  }

  /*******************************/
  /* Now look up the file itself */
  /*******************************/

  TIMEOUT(res = _dos_findfirst(lcased_file, _A_NORMAL | _A_SUBDIR, &dirp));
  /*    if (res != 0)
        {
          *Lisp_errno = errno;
          return(0);
        }
  */
  for (; res == 0; S_TOUT(res = _dos_findnext(&dirp))) {
    strcpy(name, dirp.name);
    separate_version(name, ver, 1);
    DOWNCASE(name);

    strcpy(VA.files[varray_index].name, dirp.name);
    if (*ver == '\0') {
      /* Versionless file */
      VA.files[varray_index].version_no = 1;
    } else {
      /*
       * separate_version guarantees ver is a numeric string.
       */
      VA.files[varray_index].version_no = strtoul(ver, (char **)NULL, 10);
    }
    varray_index++;
    if (varray_index >= VERSIONARRAYMAXLENGTH) {
      *Lisp_errno = EIO;
      return (0);
    } else if (varray_index >= VA.allocated) {
      VA.allocated += VERSIONARRAYCHUNKLENGTH;
      VA.files = realloc(VA.files,
                             sizeof(*VA.files) * VA.allocated);
    }
  }

  /*
   * The last entry of VA.files is indicated by setting LASTVERSIONARRAY into
   * version_no field.
   */
  VA.files[varray_index].version_no = LASTVERSIONARRAY;
  VA.lastUsed = varray_index;

  /*
   * If any files have been stored in VA.files, we store the name
   * without version in the last marker entry.
   *
   * NOTE: sorting "varray_index" entries will leave the LASTVERSIONARRAY item
   * untouched by the sort, which is intentional.
   */
  if (!NoFileP(VA.files)) {
    strcpy(name, VA.files[0].name);
    separate_version(name, ver, 1);
    strcpy(VA.files[varray_index].name, name);
    if (varray_index > 1) {
      qsort(VA.files, varray_index, sizeof(*VA.files), compare_file_versions);
    }
  }

  return (1);

#else
  /* UNIX version-array builder */
  char lcased_file[MAXNAMLEN];
  char name[MAXNAMLEN];
  char ver[VERSIONLEN];
  int varray_index = 0;
  DIR *dirp;
  struct dirent *dp;
  int rval;
  struct stat sbuf;

  /*
   * First of all, prepare a lower cased file name for the case insensitive
   * search.  Also we have to separate file name from its version field.
   */
  strcpy(lcased_file, file);
  separate_version(lcased_file, ver, 1);
  DOWNCASE(lcased_file);

  /* Cache for VA.files reinstated using nanosecond timestamps which many
   * systems provide for directory modification times.
   * POSIX defines the struct stat field containing the nanosecond resolution
   * modification time as "st_mtim".  See "version.h" for accomodations
   * for systems that call it something else (e.g., macOS st_mtimespec).
   */

  TIMEOUT(rval = stat(dir, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return(0);
  }
  if (sbuf.st_ino == VA.dir_ino &&
      0 == strcmp(lcased_file, VA.name) &&
      sbuf.st_mtim.tv_sec == VA.lastMTime.tv_sec &&
      sbuf.st_mtim.tv_nsec == VA.lastMTime.tv_nsec) {
    return (1);
  } else {
    VA.dir_ino = sbuf.st_ino;
    VA.lastMTime = sbuf.st_mtim;
    strcpy(VA.name, lcased_file);
  }

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (0);
  }

  /* There is no initialization call for the local file system, so we
   * must ensure there is initial storage allocated for the version array */
  if (VA.files == NULL) {
    VA.files = calloc(VERSIONARRAYCHUNKLENGTH, sizeof(*VA.files));
    VA.allocated = VERSIONARRAYCHUNKLENGTH;
  }
  for (S_TOUT(dp = readdir(dirp)); dp != NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)))
    if (dp) {
      strcpy(name, dp->d_name);
      separate_version(name, ver, 1);
      DOWNCASE(name);
      if (strcmp(name, lcased_file) == 0) {
        /*
         * This file can be regarded as a same file in Lisp sense.
         */
        strcpy(VA.files[varray_index].name, dp->d_name);
        if (*ver == '\0') {
          /* Versionless file */
          VA.files[varray_index].version_no = 0;
        } else {
          /*
           * separate_version guarantees ver is a numeric string.
           */
          VA.files[varray_index].version_no = strtoul(ver, (char **)NULL, 10);
        }
        varray_index++;
        if (varray_index >= VERSIONARRAYMAXLENGTH) {
          *Lisp_errno = EIO;
          return (0);
        } else if (varray_index >= VA.allocated) {
          VA.allocated += VERSIONARRAYCHUNKLENGTH;
          VA.files = realloc(VA.files,
                                 sizeof(*VA.files) * VA.allocated);
        }
      }
    }
  /*
   * The last entry of varray is indicated by setting LASTVERSIONARRAY into
   * version_no field.
   */
  VA.files[varray_index].version_no = LASTVERSIONARRAY;
  VA.lastUsed = varray_index;

  /*
   * If any files have been stored in VA.files, we store the name
   * without version in the last marker entry.
   *
   * NOTE: sorting "varray_index" entries will leave the LASTVERSIONARRAY item
   * untouched by the sort, which is intentional.
   */
  if (!NoFileP(VA.files)) {
    strcpy(name, VA.files[0].name);
    separate_version(name, ver, 1);
    strcpy(VA.files[varray_index].name, name);
    if (varray_index > 1) {
      qsort(VA.files, varray_index, sizeof(*VA.files), compare_file_versions);
    }
  }

  TIMEOUT(closedir(dirp));
  return (1);
#endif /* DOS */
}